

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_dup_impl(ggml_context *ctx,ggml_tensor *a,_Bool inplace)

{
  ggml_tensor *src;
  ggml_tensor *pgVar1;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,inplace) == 0) {
    pgVar1 = a->grad;
    src = ggml_dup_tensor(ctx,a);
    src->op = GGML_OP_DUP;
    if (pgVar1 != (ggml_tensor *)0x0) {
      pgVar1 = ggml_dup_tensor(ctx,src);
      goto LAB_0011cd8e;
    }
  }
  else {
    src = ggml_view_tensor(ctx,a);
    src->op = GGML_OP_DUP;
  }
  pgVar1 = (ggml_tensor *)0x0;
LAB_0011cd8e:
  src->grad = pgVar1;
  src->src0 = a;
  src->src1 = (ggml_tensor *)0x0;
  return src;
}

Assistant:

struct ggml_tensor * ggml_dup_impl(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        bool inplace) {
    bool is_node = false;

    if (!inplace && (a->grad)) {
        is_node = true;
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op   = GGML_OP_DUP;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}